

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccs_test.cpp
# Opt level: O3

void __thiscall CcsTest_Memory_Test::TestBody(CcsTest_Memory_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  CcsDomain *this_00;
  string *rhs;
  char *message;
  CcsContext ctx;
  CcsContext root;
  istringstream input;
  string local_288;
  string local_268;
  undefined1 local_248 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  AssertHelper local_228;
  string *local_220;
  undefined1 local_218 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_200;
  CcsContext local_1f8;
  CcsContext local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  istringstream local_1a8 [120];
  ios_base local_130 [264];
  
  this_00 = (CcsDomain *)operator_new(8);
  ::ccs::CcsDomain::CcsDomain(this_00,false);
  paVar1 = &local_288.field_2;
  local_288._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_288,"foo.bar > baz.quux: frob = \'nitz\'","");
  std::__cxx11::istringstream::istringstream(local_1a8,(string *)&local_288,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar1) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  local_288._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"<literal>","");
  ::ccs::CcsDomain::loadCcsStream
            (this_00,(istream *)local_1a8,&local_288,
             (ImportResolver *)&::ccs::(anonymous_namespace)::NoImportResolver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar1) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  ::ccs::CcsDomain::build((CcsDomain *)&local_1e8);
  ::ccs::CcsDomain::~CcsDomain(this_00);
  operator_delete(this_00,8);
  local_288._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"foo","");
  paVar2 = &local_268.field_2;
  local_268._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"bar","");
  anon_unknown.dwarf_3f170::v
            (&local_1c0,(anon_unknown_dwarf_3f170 *)local_268._M_dataplus._M_p,
             (string *)local_268._M_string_length);
  ::ccs::CcsContext::CcsContext((CcsContext *)(local_218 + 0x10),&local_1e8,&local_288,&local_1c0);
  local_248 = (undefined1  [8])&local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"baz","");
  local_228.data_ = (AssertHelperData *)local_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"quux","");
  anon_unknown.dwarf_3f170::v(&local_1d8,(anon_unknown_dwarf_3f170 *)local_228.data_,local_220);
  ::ccs::CcsContext::CcsContext
            (&local_1f8,(CcsContext *)(local_218 + 0x10),(string *)local_248,&local_1d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1d8);
  if (local_228.data_ != (AssertHelperData *)local_218) {
    operator_delete(local_228.data_,local_218._0_8_ + 1);
  }
  if (local_248 != (undefined1  [8])&local_238) {
    operator_delete((void *)local_248,local_238._M_allocated_capacity + 1);
  }
  if (local_200 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_200);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar1) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  local_288.field_2._M_allocated_capacity = 0;
  local_288.field_2._8_8_ = 0;
  local_288._M_string_length = 0;
  local_288._M_dataplus._M_p = (pointer)paVar1;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_268._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"frob","");
    rhs = ::ccs::CcsContext::getString(&local_1f8,&local_268);
    testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
              ((internal *)local_248,"\"nitz\"","ctx.getString(\"frob\")",(char (*) [5])"nitz",rhs);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if (local_248[0] == (string)0x0) {
      testing::Message::Message((Message *)&local_268);
      if (local_240 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = (local_240->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_228,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp"
                 ,0x23,message);
      testing::internal::AssertHelper::operator=(&local_228,(Message *)&local_268);
      testing::internal::AssertHelper::~AssertHelper(&local_228);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_268._M_dataplus._M_p + 8))();
      }
    }
    if (local_240 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_240,local_240);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar1) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if (local_1f8.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f8.searchState.
               super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_1e8.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1e8.searchState.
               super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  std::__cxx11::istringstream::~istringstream(local_1a8);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

TEST(CcsTest, Memory) {
  CcsDomain *ccs = new CcsDomain();
  std::istringstream input("foo.bar > baz.quux: frob = 'nitz'");
  ccs->loadCcsStream(input, "<literal>", ImportResolver::None);
  CcsContext root = ccs->build();
  delete ccs;
  CcsContext ctx = root.constrain("foo", v("bar")).constrain("baz", v("quux"));
  ASSERT_NO_THROW(EXPECT_EQ("nitz", ctx.getString("frob")));
}